

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void google::protobuf::MessageFactory::InternalRegisterGeneratedFile
               (char *filename,RegistrationFunc *register_messages)

{
  GeneratedMessageFactory *pGVar1;
  LogMessage *pLVar2;
  pair<std::tr1::__detail::_Hashtable_iterator<std::pair<const_char_*const,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false,_false>,_bool>
  ret;
  char *local_58;
  RegistrationFunc *local_50;
  LogMessage local_48;
  
  pGVar1 = anon_unknown_0::GeneratedMessageFactory::singleton();
  local_58 = filename;
  local_50 = register_messages;
  std::tr1::
  _Hashtable<const_char_*,_std::pair<const_char_*const,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::pair<const_char_*const,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::_Select1st<std::pair<const_char_*const,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  ::_M_insert(&local_48,
              (_Hashtable<const_char_*,_std::pair<const_char_*const,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::pair<const_char_*const,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::_Select1st<std::pair<const_char_*const,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
               *)&pGVar1->file_map_);
  if ((char)local_48.line_ == '\0') {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/message.cc"
               ,0x118);
    pLVar2 = internal::LogMessage::operator<<(&local_48,"File is already registered: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,filename);
    internal::LogFinisher::operator=((LogFinisher *)&local_58,pLVar2);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return;
}

Assistant:

void MessageFactory::InternalRegisterGeneratedFile(
    const char* filename, void (*register_messages)(const string&)) {
  GeneratedMessageFactory::singleton()->RegisterFile(filename,
                                                     register_messages);
}